

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

void BinaryenSIMDExtractSetVec(BinaryenExpressionRef expr,BinaryenExpressionRef vecExpr)

{
  if (expr->_id != SIMDExtractId) {
    __assert_fail("expression->is<SIMDExtract>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0xc5c,
                  "void BinaryenSIMDExtractSetVec(BinaryenExpressionRef, BinaryenExpressionRef)");
  }
  if (vecExpr != (BinaryenExpressionRef)0x0) {
    expr[1].type.id = (uintptr_t)vecExpr;
    return;
  }
  __assert_fail("vecExpr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0xc5d,
                "void BinaryenSIMDExtractSetVec(BinaryenExpressionRef, BinaryenExpressionRef)");
}

Assistant:

void BinaryenSIMDExtractSetVec(BinaryenExpressionRef expr,
                               BinaryenExpressionRef vecExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<SIMDExtract>());
  assert(vecExpr);
  static_cast<SIMDExtract*>(expression)->vec = (Expression*)vecExpr;
}